

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O0

string * __thiscall
SndIOBackendFactory::probe_abi_cxx11_(SndIOBackendFactory *this,BackendType type)

{
  uint in_EDX;
  string *in_RDI;
  string *outnames;
  
  std::__cxx11::string::string((string *)in_RDI);
  if (in_EDX < 2) {
    std::__cxx11::string::append((char *)in_RDI,0x273f60);
  }
  return in_RDI;
}

Assistant:

std::string SndIOBackendFactory::probe(BackendType type)
{
    std::string outnames;
    switch(type)
    {
    case BackendType::Playback:
    case BackendType::Capture:
        /* Includes null char. */
        outnames.append(sndio_device, sizeof(sndio_device));
        break;
    }
    return outnames;
}